

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMvMBIntersectorKMoeller<4,_8,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  Geometry *pGVar1;
  RTCFilterFunctionN p_Var2;
  undefined1 auVar3 [32];
  undefined1 (*pauVar4) [16];
  int iVar5;
  undefined4 uVar6;
  AABBNodeMB4D *node1;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  undefined1 (*pauVar18) [16];
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  vint4 bi_1;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [64];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  vint4 bi;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  vint4 ai;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar48;
  float fVar49;
  float fVar50;
  undefined1 auVar47 [64];
  undefined1 auVar51 [16];
  undefined1 auVar52 [64];
  undefined1 auVar53 [16];
  uint uVar55;
  uint uVar56;
  uint uVar57;
  undefined1 auVar54 [64];
  undefined1 auVar58 [16];
  undefined1 auVar59 [64];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [64];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [64];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [64];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_12e0 [16];
  undefined1 local_12d0 [16];
  long local_12b8;
  long local_12b0;
  ulong local_12a8;
  ulong local_12a0;
  Scene *local_1298;
  RTCFilterFunctionNArguments local_1290;
  undefined1 local_1260 [32];
  undefined1 local_1230 [16];
  undefined1 local_1220 [16];
  undefined1 local_1210 [16];
  undefined1 local_1200 [16];
  undefined1 local_11f0 [16];
  undefined1 local_11e0 [16];
  undefined1 local_11d0 [16];
  undefined1 local_11c0 [16];
  undefined1 local_11b0 [16];
  undefined1 local_11a0 [16];
  undefined1 local_1190 [16];
  undefined1 local_1180 [16];
  undefined1 local_1170 [16];
  undefined1 local_1150 [16];
  float local_1140 [4];
  float local_1130 [4];
  undefined1 local_1120 [16];
  undefined1 local_1110 [16];
  undefined1 local_1100 [16];
  undefined1 local_10f0 [16];
  undefined1 local_10e0 [32];
  RTCHitN local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  float local_1040;
  float fStack_103c;
  float fStack_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float fStack_1028;
  float fStack_1024;
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  uint local_fe0;
  uint uStack_fdc;
  uint uStack_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  uint uStack_fc8;
  uint uStack_fc4;
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  undefined1 auVar37 [32];
  undefined1 auVar40 [32];
  
  pauVar18 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  fVar44 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar72 = ZEXT1664(CONCAT412(fVar44,CONCAT48(fVar44,CONCAT44(fVar44,fVar44))));
  fVar48 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_11b0._4_4_ = fVar48;
  local_11b0._0_4_ = fVar48;
  local_11b0._8_4_ = fVar48;
  local_11b0._12_4_ = fVar48;
  auVar47 = ZEXT1664(local_11b0);
  fVar49 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_11c0._4_4_ = fVar49;
  local_11c0._0_4_ = fVar49;
  local_11c0._8_4_ = fVar49;
  local_11c0._12_4_ = fVar49;
  auVar52 = ZEXT1664(local_11c0);
  fVar44 = fVar44 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar48 = fVar48 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar49 = fVar49 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  uVar17 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar15 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar16 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  uVar19 = uVar17 ^ 0x10;
  uVar21 = uVar15 ^ 0x10;
  iVar5 = (tray->tfar).field_0.i[k];
  auVar26 = ZEXT1664(CONCAT412(iVar5,CONCAT48(iVar5,CONCAT44(iVar5,iVar5))));
  local_11d0._8_4_ = 0x80000000;
  local_11d0._0_8_ = 0x8000000080000000;
  local_11d0._12_4_ = 0x80000000;
  local_11e0._0_8_ = CONCAT44(fVar44,fVar44) ^ 0x8000000080000000;
  local_11e0._8_4_ = -fVar44;
  local_11e0._12_4_ = -fVar44;
  auVar54 = ZEXT1664(local_11e0);
  local_11f0._0_8_ = CONCAT44(fVar48,fVar48) ^ 0x8000000080000000;
  local_11f0._8_4_ = -fVar48;
  local_11f0._12_4_ = -fVar48;
  auVar59 = ZEXT1664(local_11f0);
  local_1200._0_8_ = CONCAT44(fVar49,fVar49) ^ 0x8000000080000000;
  local_1200._8_4_ = -fVar49;
  local_1200._12_4_ = -fVar49;
  auVar62 = ZEXT1664(local_1200);
  iVar5 = (tray->tnear).field_0.i[k];
  local_1210._4_4_ = iVar5;
  local_1210._0_4_ = iVar5;
  local_1210._8_4_ = iVar5;
  local_1210._12_4_ = iVar5;
  auVar65 = ZEXT1664(local_1210);
  iVar5 = 1 << ((uint)k & 0x1f);
  auVar34._4_4_ = iVar5;
  auVar34._0_4_ = iVar5;
  auVar34._8_4_ = iVar5;
  auVar34._12_4_ = iVar5;
  auVar34._16_4_ = iVar5;
  auVar34._20_4_ = iVar5;
  auVar34._24_4_ = iVar5;
  auVar34._28_4_ = iVar5;
  auVar37 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar34 = vpand_avx2(auVar34,auVar37);
  local_10e0 = vpcmpeqd_avx2(auVar34,auVar37);
LAB_015ed8a1:
  do {
    do {
      if (pauVar18 == (undefined1 (*) [16])&local_fa0) {
        return;
      }
      pauVar4 = pauVar18 + -1;
      pauVar18 = pauVar18 + -1;
    } while (*(float *)(ray + k * 4 + 0x100) < *(float *)(*pauVar4 + 8));
    uVar20 = *(ulong *)*pauVar18;
    while ((uVar20 & 8) == 0) {
      uVar7 = uVar20 & 0xfffffffffffffff0;
      uVar6 = *(undefined4 *)(ray + k * 4 + 0xe0);
      auVar27._4_4_ = uVar6;
      auVar27._0_4_ = uVar6;
      auVar27._8_4_ = uVar6;
      auVar27._12_4_ = uVar6;
      auVar29 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar7 + 0x80 + uVar17),auVar27,
                                *(undefined1 (*) [16])(uVar7 + 0x20 + uVar17));
      auVar29 = vfmadd213ps_fma(auVar29,auVar72._0_16_,auVar54._0_16_);
      auVar28 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar7 + 0x80 + uVar15),auVar27,
                                *(undefined1 (*) [16])(uVar7 + 0x20 + uVar15));
      auVar28 = vfmadd213ps_fma(auVar28,auVar47._0_16_,auVar59._0_16_);
      auVar29 = vpmaxsd_avx(auVar29,auVar28);
      auVar28 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar7 + 0x80 + uVar16),auVar27,
                                *(undefined1 (*) [16])(uVar7 + 0x20 + uVar16));
      auVar28 = vfmadd213ps_fma(auVar28,auVar52._0_16_,auVar62._0_16_);
      auVar28 = vpmaxsd_avx(auVar28,auVar65._0_16_);
      auVar29 = vpmaxsd_avx(auVar29,auVar28);
      auVar28 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar7 + 0x80 + uVar19),auVar27,
                                *(undefined1 (*) [16])(uVar7 + 0x20 + uVar19));
      auVar28 = vfmadd213ps_fma(auVar28,auVar72._0_16_,auVar54._0_16_);
      auVar38 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar7 + 0x80 + uVar21),auVar27,
                                *(undefined1 (*) [16])(uVar7 + 0x20 + uVar21));
      auVar38 = vfmadd213ps_fma(auVar38,auVar47._0_16_,auVar59._0_16_);
      auVar28 = vpminsd_avx(auVar28,auVar38);
      auVar38 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar7 + 0x80 + (uVar16 ^ 0x10)),auVar27,
                                *(undefined1 (*) [16])(uVar7 + 0x20 + (uVar16 ^ 0x10)));
      auVar38 = vfmadd213ps_fma(auVar38,auVar52._0_16_,auVar62._0_16_);
      auVar38 = vpminsd_avx(auVar38,auVar26._0_16_);
      auVar28 = vpminsd_avx(auVar28,auVar38);
      if (((uint)uVar20 & 7) == 6) {
        auVar38 = vcmpps_avx(auVar29,auVar28,2);
        auVar28 = vcmpps_avx(*(undefined1 (*) [16])(uVar7 + 0xe0),auVar27,2);
        auVar27 = vcmpps_avx(auVar27,*(undefined1 (*) [16])(uVar7 + 0xf0),1);
        auVar28 = vandps_avx(auVar28,auVar27);
        auVar28 = vandps_avx(auVar28,auVar38);
      }
      else {
        auVar28 = vcmpps_avx(auVar29,auVar28,2);
      }
      auVar28 = vpslld_avx(auVar28,0x1f);
      uVar9 = vmovmskps_avx(auVar28);
      local_10c0[0] = (RTCHitN)auVar29[0];
      local_10c0[1] = (RTCHitN)auVar29[1];
      local_10c0[2] = (RTCHitN)auVar29[2];
      local_10c0[3] = (RTCHitN)auVar29[3];
      local_10c0[4] = (RTCHitN)auVar29[4];
      local_10c0[5] = (RTCHitN)auVar29[5];
      local_10c0[6] = (RTCHitN)auVar29[6];
      local_10c0[7] = (RTCHitN)auVar29[7];
      local_10c0[8] = (RTCHitN)auVar29[8];
      local_10c0[9] = (RTCHitN)auVar29[9];
      local_10c0[10] = (RTCHitN)auVar29[10];
      local_10c0[0xb] = (RTCHitN)auVar29[0xb];
      local_10c0[0xc] = (RTCHitN)auVar29[0xc];
      local_10c0[0xd] = (RTCHitN)auVar29[0xd];
      local_10c0[0xe] = (RTCHitN)auVar29[0xe];
      local_10c0[0xf] = (RTCHitN)auVar29[0xf];
      if (uVar9 == 0) goto LAB_015ed8a1;
      uVar9 = uVar9 & 0xff;
      lVar12 = 0;
      for (uVar20 = (ulong)uVar9; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
        lVar12 = lVar12 + 1;
      }
      uVar20 = *(ulong *)(uVar7 + lVar12 * 8);
      uVar9 = uVar9 - 1 & uVar9;
      uVar10 = (ulong)uVar9;
      if (uVar9 != 0) {
        uVar55 = *(uint *)(local_10c0 + lVar12 * 4);
        lVar12 = 0;
        for (; (uVar10 & 1) == 0; uVar10 = uVar10 >> 1 | 0x8000000000000000) {
          lVar12 = lVar12 + 1;
        }
        uVar9 = uVar9 - 1 & uVar9;
        uVar13 = (ulong)uVar9;
        uVar10 = *(ulong *)(uVar7 + lVar12 * 8);
        uVar56 = *(uint *)(local_10c0 + lVar12 * 4);
        if (uVar9 == 0) {
          if (uVar55 < uVar56) {
            *(ulong *)*pauVar18 = uVar10;
            *(uint *)(*pauVar18 + 8) = uVar56;
            pauVar18 = pauVar18 + 1;
          }
          else {
            *(ulong *)*pauVar18 = uVar20;
            *(uint *)(*pauVar18 + 8) = uVar55;
            pauVar18 = pauVar18 + 1;
            uVar20 = uVar10;
          }
        }
        else {
          auVar29._8_8_ = 0;
          auVar29._0_8_ = uVar20;
          auVar29 = vpunpcklqdq_avx(auVar29,ZEXT416(uVar55));
          auVar28._8_8_ = 0;
          auVar28._0_8_ = uVar10;
          auVar28 = vpunpcklqdq_avx(auVar28,ZEXT416(uVar56));
          lVar12 = 0;
          for (; (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x8000000000000000) {
            lVar12 = lVar12 + 1;
          }
          uVar9 = uVar9 - 1 & uVar9;
          uVar20 = (ulong)uVar9;
          auVar38._8_8_ = 0;
          auVar38._0_8_ = *(ulong *)(uVar7 + lVar12 * 8);
          auVar27 = vpunpcklqdq_avx(auVar38,ZEXT416(*(uint *)(local_10c0 + lVar12 * 4)));
          auVar38 = vpcmpgtd_avx(auVar28,auVar29);
          if (uVar9 == 0) {
            auVar41 = vpshufd_avx(auVar38,0xaa);
            auVar38 = vblendvps_avx(auVar28,auVar29,auVar41);
            auVar29 = vblendvps_avx(auVar29,auVar28,auVar41);
            auVar28 = vpcmpgtd_avx(auVar27,auVar38);
            auVar41 = vpshufd_avx(auVar28,0xaa);
            auVar28 = vblendvps_avx(auVar27,auVar38,auVar41);
            auVar38 = vblendvps_avx(auVar38,auVar27,auVar41);
            auVar27 = vpcmpgtd_avx(auVar38,auVar29);
            auVar41 = vpshufd_avx(auVar27,0xaa);
            auVar27 = vblendvps_avx(auVar38,auVar29,auVar41);
            auVar29 = vblendvps_avx(auVar29,auVar38,auVar41);
            *pauVar18 = auVar29;
            pauVar18[1] = auVar27;
            uVar20 = auVar28._0_8_;
            pauVar18 = pauVar18 + 2;
          }
          else {
            lVar12 = 0;
            for (; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
              lVar12 = lVar12 + 1;
            }
            auVar41._8_8_ = 0;
            auVar41._0_8_ = *(ulong *)(uVar7 + lVar12 * 8);
            auVar46 = vpunpcklqdq_avx(auVar41,ZEXT416(*(uint *)(local_10c0 + lVar12 * 4)));
            auVar41 = vpshufd_avx(auVar38,0xaa);
            auVar38 = vblendvps_avx(auVar28,auVar29,auVar41);
            auVar29 = vblendvps_avx(auVar29,auVar28,auVar41);
            auVar28 = vpcmpgtd_avx(auVar46,auVar27);
            auVar41 = vpshufd_avx(auVar28,0xaa);
            auVar28 = vblendvps_avx(auVar46,auVar27,auVar41);
            auVar27 = vblendvps_avx(auVar27,auVar46,auVar41);
            auVar41 = vpcmpgtd_avx(auVar27,auVar29);
            auVar46 = vpshufd_avx(auVar41,0xaa);
            auVar41 = vblendvps_avx(auVar27,auVar29,auVar46);
            auVar29 = vblendvps_avx(auVar29,auVar27,auVar46);
            auVar27 = vpcmpgtd_avx(auVar28,auVar38);
            auVar46 = vpshufd_avx(auVar27,0xaa);
            auVar27 = vblendvps_avx(auVar28,auVar38,auVar46);
            auVar28 = vblendvps_avx(auVar38,auVar28,auVar46);
            auVar38 = vpcmpgtd_avx(auVar41,auVar28);
            auVar46 = vpshufd_avx(auVar38,0xaa);
            auVar38 = vblendvps_avx(auVar41,auVar28,auVar46);
            auVar28 = vblendvps_avx(auVar28,auVar41,auVar46);
            *pauVar18 = auVar29;
            pauVar18[1] = auVar28;
            pauVar18[2] = auVar38;
            uVar20 = auVar27._0_8_;
            pauVar18 = pauVar18 + 3;
          }
        }
      }
    }
    lVar12 = (ulong)((uint)uVar20 & 0xf) - 8;
    uVar20 = uVar20 & 0xfffffffffffffff0;
    for (lVar14 = 0; lVar14 != lVar12; lVar14 = lVar14 + 1) {
      lVar11 = lVar14 * 0x140;
      uVar6 = *(undefined4 *)(ray + k * 4 + 0xe0);
      auVar22._4_4_ = uVar6;
      auVar22._0_4_ = uVar6;
      auVar22._8_4_ = uVar6;
      auVar22._12_4_ = uVar6;
      auVar35 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar20 + 0x90 + lVar11),auVar22,
                                *(undefined1 (*) [16])(uVar20 + lVar11));
      auVar43 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar20 + 0xa0 + lVar11),auVar22,
                                *(undefined1 (*) [16])(uVar20 + 0x10 + lVar11));
      auVar31 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar20 + 0xb0 + lVar11),auVar22,
                                *(undefined1 (*) [16])(uVar20 + 0x20 + lVar11));
      auVar29 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar20 + 0xc0 + lVar11),auVar22,
                                *(undefined1 (*) [16])(uVar20 + 0x30 + lVar11));
      auVar38 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar20 + 0xd0 + lVar11),auVar22,
                                *(undefined1 (*) [16])(uVar20 + 0x40 + lVar11));
      auVar27 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar20 + 0xe0 + lVar11),auVar22,
                                *(undefined1 (*) [16])(uVar20 + 0x50 + lVar11));
      auVar41 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar20 + 0xf0 + lVar11),auVar22,
                                *(undefined1 (*) [16])(uVar20 + 0x60 + lVar11));
      auVar46 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar20 + 0x100 + lVar11),auVar22,
                                *(undefined1 (*) [16])(uVar20 + 0x70 + lVar11));
      auVar22 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar20 + 0x110 + lVar11),auVar22,
                                *(undefined1 (*) [16])(uVar20 + 0x80 + lVar11));
      auVar28 = vsubps_avx(auVar35,auVar29);
      auVar29 = vsubps_avx(auVar43,auVar38);
      auVar38 = vsubps_avx(auVar31,auVar27);
      auVar27 = vsubps_avx(auVar41,auVar35);
      auVar41 = vsubps_avx(auVar46,auVar43);
      auVar46 = vsubps_avx(auVar22,auVar31);
      auVar23._0_4_ = auVar46._0_4_ * auVar29._0_4_;
      auVar23._4_4_ = auVar46._4_4_ * auVar29._4_4_;
      auVar23._8_4_ = auVar46._8_4_ * auVar29._8_4_;
      auVar23._12_4_ = auVar46._12_4_ * auVar29._12_4_;
      local_1110 = vfmsub231ps_fma(auVar23,auVar41,auVar38);
      auVar30._0_4_ = auVar38._0_4_ * auVar27._0_4_;
      auVar30._4_4_ = auVar38._4_4_ * auVar27._4_4_;
      auVar30._8_4_ = auVar38._8_4_ * auVar27._8_4_;
      auVar30._12_4_ = auVar38._12_4_ * auVar27._12_4_;
      local_1100 = vfmsub231ps_fma(auVar30,auVar46,auVar28);
      uVar6 = *(undefined4 *)(ray + k * 4);
      auVar63._4_4_ = uVar6;
      auVar63._0_4_ = uVar6;
      auVar63._8_4_ = uVar6;
      auVar63._12_4_ = uVar6;
      uVar6 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar66._4_4_ = uVar6;
      auVar66._0_4_ = uVar6;
      auVar66._8_4_ = uVar6;
      auVar66._12_4_ = uVar6;
      uVar6 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar69._4_4_ = uVar6;
      auVar69._0_4_ = uVar6;
      auVar69._8_4_ = uVar6;
      auVar69._12_4_ = uVar6;
      fVar44 = *(float *)(ray + k * 4 + 0x80);
      auVar58._4_4_ = fVar44;
      auVar58._0_4_ = fVar44;
      auVar58._8_4_ = fVar44;
      auVar58._12_4_ = fVar44;
      auVar35 = vsubps_avx(auVar35,auVar63);
      fVar48 = *(float *)(ray + k * 4 + 0xa0);
      auVar64._4_4_ = fVar48;
      auVar64._0_4_ = fVar48;
      auVar64._8_4_ = fVar48;
      auVar64._12_4_ = fVar48;
      auVar43 = vsubps_avx(auVar43,auVar66);
      fVar49 = *(float *)(ray + k * 4 + 0xc0);
      auVar67._4_4_ = fVar49;
      auVar67._0_4_ = fVar49;
      auVar67._8_4_ = fVar49;
      auVar67._12_4_ = fVar49;
      auVar31 = vsubps_avx(auVar31,auVar69);
      auVar70._0_4_ = fVar44 * auVar43._0_4_;
      auVar70._4_4_ = fVar44 * auVar43._4_4_;
      auVar70._8_4_ = fVar44 * auVar43._8_4_;
      auVar70._12_4_ = fVar44 * auVar43._12_4_;
      auVar22 = vfmsub231ps_fma(auVar70,auVar35,auVar64);
      auVar60._0_4_ = auVar46._0_4_ * auVar22._0_4_;
      auVar60._4_4_ = auVar46._4_4_ * auVar22._4_4_;
      auVar60._8_4_ = auVar46._8_4_ * auVar22._8_4_;
      auVar60._12_4_ = auVar46._12_4_ * auVar22._12_4_;
      auVar71._0_4_ = auVar38._0_4_ * auVar22._0_4_;
      auVar71._4_4_ = auVar38._4_4_ * auVar22._4_4_;
      auVar71._8_4_ = auVar38._8_4_ * auVar22._8_4_;
      auVar71._12_4_ = auVar38._12_4_ * auVar22._12_4_;
      auVar53._0_4_ = fVar49 * auVar35._0_4_;
      auVar53._4_4_ = fVar49 * auVar35._4_4_;
      auVar53._8_4_ = fVar49 * auVar35._8_4_;
      auVar53._12_4_ = fVar49 * auVar35._12_4_;
      auVar46 = vfmsub231ps_fma(auVar53,auVar31,auVar58);
      auVar38 = vfmadd231ps_fma(auVar60,auVar46,auVar41);
      auVar46 = vfmadd231ps_fma(auVar71,auVar29,auVar46);
      auVar51._0_4_ = auVar41._0_4_ * auVar28._0_4_;
      auVar51._4_4_ = auVar41._4_4_ * auVar28._4_4_;
      auVar51._8_4_ = auVar41._8_4_ * auVar28._8_4_;
      auVar51._12_4_ = auVar41._12_4_ * auVar28._12_4_;
      local_10f0 = vfmsub231ps_fma(auVar51,auVar27,auVar29);
      auVar45._0_4_ = fVar48 * auVar31._0_4_;
      auVar45._4_4_ = fVar48 * auVar31._4_4_;
      auVar45._8_4_ = fVar48 * auVar31._8_4_;
      auVar45._12_4_ = fVar48 * auVar31._12_4_;
      auVar22 = vfmsub231ps_fma(auVar45,auVar43,auVar67);
      auVar68._0_4_ = local_10f0._0_4_ * fVar49;
      auVar68._4_4_ = local_10f0._4_4_ * fVar49;
      auVar68._8_4_ = local_10f0._8_4_ * fVar49;
      auVar68._12_4_ = local_10f0._12_4_ * fVar49;
      auVar29 = vfmadd231ps_fma(auVar68,local_1100,auVar64);
      auVar41 = vfmadd231ps_fma(auVar29,local_1110,auVar58);
      auVar38 = vfmadd231ps_fma(auVar38,auVar22,auVar27);
      auVar29 = vandps_avx(auVar41,local_11d0);
      uVar9 = auVar29._0_4_;
      local_11a0._0_4_ = (float)(uVar9 ^ auVar38._0_4_);
      uVar55 = auVar29._4_4_;
      local_11a0._4_4_ = (float)(uVar55 ^ auVar38._4_4_);
      uVar56 = auVar29._8_4_;
      local_11a0._8_4_ = (float)(uVar56 ^ auVar38._8_4_);
      uVar57 = auVar29._12_4_;
      local_11a0._12_4_ = (float)(uVar57 ^ auVar38._12_4_);
      auVar29 = vfmadd231ps_fma(auVar46,auVar28,auVar22);
      local_1190._0_4_ = (float)(uVar9 ^ auVar29._0_4_);
      local_1190._4_4_ = (float)(uVar55 ^ auVar29._4_4_);
      local_1190._8_4_ = (float)(uVar56 ^ auVar29._8_4_);
      local_1190._12_4_ = (float)(uVar57 ^ auVar29._12_4_);
      auVar38 = ZEXT816(0) << 0x20;
      auVar29 = vcmpps_avx(local_11a0,auVar38,5);
      auVar28 = vcmpps_avx(local_1190,auVar38,5);
      auVar29 = vandps_avx(auVar28,auVar29);
      auVar46._8_4_ = 0x7fffffff;
      auVar46._0_8_ = 0x7fffffff7fffffff;
      auVar46._12_4_ = 0x7fffffff;
      local_1170 = vandps_avx(auVar41,auVar46);
      auVar28 = vcmpps_avx(auVar41,auVar38,4);
      auVar29 = vandps_avx(auVar29,auVar28);
      auVar61._0_4_ = local_11a0._0_4_ + local_1190._0_4_;
      auVar61._4_4_ = local_11a0._4_4_ + local_1190._4_4_;
      auVar61._8_4_ = local_11a0._8_4_ + local_1190._8_4_;
      auVar61._12_4_ = local_11a0._12_4_ + local_1190._12_4_;
      auVar28 = vcmpps_avx(auVar61,local_1170,2);
      auVar38 = auVar28 & auVar29;
      if ((((auVar38 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar38 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar38 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar38[0xf] < '\0'
         ) {
        auVar29 = vandps_avx(auVar29,auVar28);
        auVar42._0_4_ = local_10f0._0_4_ * auVar31._0_4_;
        auVar42._4_4_ = local_10f0._4_4_ * auVar31._4_4_;
        auVar42._8_4_ = local_10f0._8_4_ * auVar31._8_4_;
        auVar42._12_4_ = local_10f0._12_4_ * auVar31._12_4_;
        auVar28 = vfmadd213ps_fma(auVar43,local_1100,auVar42);
        auVar28 = vfmadd213ps_fma(auVar35,local_1110,auVar28);
        local_1180._0_4_ = (float)(uVar9 ^ auVar28._0_4_);
        local_1180._4_4_ = (float)(uVar55 ^ auVar28._4_4_);
        local_1180._8_4_ = (float)(uVar56 ^ auVar28._8_4_);
        local_1180._12_4_ = (float)(uVar57 ^ auVar28._12_4_);
        fVar44 = *(float *)(ray + k * 4 + 0x60);
        auVar35._0_4_ = local_1170._0_4_ * fVar44;
        auVar35._4_4_ = local_1170._4_4_ * fVar44;
        auVar35._8_4_ = local_1170._8_4_ * fVar44;
        auVar35._12_4_ = local_1170._12_4_ * fVar44;
        auVar28 = vcmpps_avx(auVar35,local_1180,1);
        fVar44 = *(float *)(ray + k * 4 + 0x100);
        auVar26 = ZEXT1664(CONCAT412(fVar44,CONCAT48(fVar44,CONCAT44(fVar44,fVar44))));
        auVar43._0_4_ = fVar44 * local_1170._0_4_;
        auVar43._4_4_ = fVar44 * local_1170._4_4_;
        auVar43._8_4_ = fVar44 * local_1170._8_4_;
        auVar43._12_4_ = fVar44 * local_1170._12_4_;
        auVar38 = vcmpps_avx(local_1180,auVar43,2);
        auVar28 = vandps_avx(auVar28,auVar38);
        auVar38 = auVar29 & auVar28;
        if ((((auVar38 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar38 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar38 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar38[0xf] < '\0') {
          local_12e0 = vandps_avx(auVar29,auVar28);
          local_1298 = context->scene;
          auVar29 = vrcpps_avx(local_1170);
          auVar31._8_4_ = 0x3f800000;
          auVar31._0_8_ = 0x3f8000003f800000;
          auVar31._12_4_ = 0x3f800000;
          auVar28 = vfnmadd213ps_fma(local_1170,auVar29,auVar31);
          auVar29 = vfmadd132ps_fma(auVar28,auVar29,auVar29);
          fVar44 = auVar29._0_4_;
          local_1120._0_4_ = fVar44 * local_1180._0_4_;
          fVar48 = auVar29._4_4_;
          local_1120._4_4_ = fVar48 * local_1180._4_4_;
          fVar49 = auVar29._8_4_;
          local_1120._8_4_ = fVar49 * local_1180._8_4_;
          fVar50 = auVar29._12_4_;
          local_1120._12_4_ = fVar50 * local_1180._12_4_;
          auVar47 = ZEXT1664(local_1120);
          local_1140[0] = fVar44 * local_11a0._0_4_;
          local_1140[1] = fVar48 * local_11a0._4_4_;
          local_1140[2] = fVar49 * local_11a0._8_4_;
          local_1140[3] = fVar50 * local_11a0._12_4_;
          auVar32._8_4_ = 0x7f800000;
          auVar32._0_8_ = 0x7f8000007f800000;
          auVar32._12_4_ = 0x7f800000;
          auVar29 = vblendvps_avx(auVar32,local_1120,local_12e0);
          local_1130[0] = fVar44 * local_1190._0_4_;
          local_1130[1] = fVar48 * local_1190._4_4_;
          local_1130[2] = fVar49 * local_1190._8_4_;
          local_1130[3] = fVar50 * local_1190._12_4_;
          auVar28 = vshufps_avx(auVar29,auVar29,0xb1);
          auVar28 = vminps_avx(auVar28,auVar29);
          auVar38 = vshufpd_avx(auVar28,auVar28,1);
          auVar28 = vminps_avx(auVar38,auVar28);
          auVar29 = vcmpps_avx(auVar29,auVar28,0);
          auVar38 = local_12e0 & auVar29;
          auVar28 = vpcmpeqd_avx(auVar28,auVar28);
          if ((((auVar38 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar38 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar38 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar38[0xf] < '\0') {
            auVar28 = auVar29;
          }
          lVar11 = lVar11 + uVar20;
          auVar29 = vandps_avx(local_12e0,auVar28);
          uVar6 = vmovmskps_avx(auVar29);
          lVar8 = 0;
          for (uVar7 = CONCAT44((int)((ulong)local_1298 >> 0x20),uVar6); local_1150 = local_12e0,
              (uVar7 & 1) == 0; uVar7 = uVar7 >> 1 | 0x8000000000000000) {
            lVar8 = lVar8 + 1;
          }
          do {
            local_1220 = auVar72._0_16_;
            local_12d0 = auVar26._0_16_;
            uVar9 = *(uint *)(lVar11 + 0x120 + lVar8 * 4);
            pGVar1 = (local_1298->geometries).items[uVar9].ptr;
            if ((pGVar1->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
              *(undefined4 *)(local_12e0 + lVar8 * 4) = 0;
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar1->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar44 = local_1140[lVar8];
                fVar48 = local_1130[lVar8];
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_1120 + lVar8 * 4);
                *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_1110 + lVar8 * 4);
                *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_1100 + lVar8 * 4);
                *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_10f0 + lVar8 * 4);
                *(float *)(ray + k * 4 + 0x1e0) = fVar44;
                *(float *)(ray + k * 4 + 0x200) = fVar48;
                *(undefined4 *)(ray + k * 4 + 0x220) = *(undefined4 *)(lVar11 + 0x130 + lVar8 * 4);
                *(uint *)(ray + k * 4 + 0x240) = uVar9;
                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                break;
              }
              local_1230 = auVar47._0_16_;
              fVar44 = local_1140[lVar8];
              local_1060._4_4_ = fVar44;
              local_1060._0_4_ = fVar44;
              local_1060._8_4_ = fVar44;
              local_1060._12_4_ = fVar44;
              local_1060._16_4_ = fVar44;
              local_1060._20_4_ = fVar44;
              local_1060._24_4_ = fVar44;
              local_1060._28_4_ = fVar44;
              local_1040 = local_1130[lVar8];
              uVar6 = *(undefined4 *)(lVar11 + 0x130 + lVar8 * 4);
              auVar39._4_4_ = uVar6;
              auVar39._0_4_ = uVar6;
              auVar39._8_4_ = uVar6;
              auVar39._12_4_ = uVar6;
              auVar40._16_4_ = uVar6;
              auVar40._0_16_ = auVar39;
              auVar40._20_4_ = uVar6;
              auVar40._24_4_ = uVar6;
              auVar40._28_4_ = uVar6;
              local_10c0._4_4_ = *(undefined4 *)(local_1110 + lVar8 * 4);
              uVar6 = *(undefined4 *)(local_1100 + lVar8 * 4);
              local_10a0._4_4_ = uVar6;
              local_10a0._0_4_ = uVar6;
              local_10a0._8_4_ = uVar6;
              local_10a0._12_4_ = uVar6;
              local_10a0._16_4_ = uVar6;
              local_10a0._20_4_ = uVar6;
              local_10a0._24_4_ = uVar6;
              local_10a0._28_4_ = uVar6;
              uVar6 = *(undefined4 *)(local_10f0 + lVar8 * 4);
              local_1080._4_4_ = uVar6;
              local_1080._0_4_ = uVar6;
              local_1080._8_4_ = uVar6;
              local_1080._12_4_ = uVar6;
              local_1080._16_4_ = uVar6;
              local_1080._20_4_ = uVar6;
              local_1080._24_4_ = uVar6;
              local_1080._28_4_ = uVar6;
              auVar36._4_4_ = uVar9;
              auVar36._0_4_ = uVar9;
              auVar36._8_4_ = uVar9;
              auVar36._12_4_ = uVar9;
              auVar37._16_4_ = uVar9;
              auVar37._0_16_ = auVar36;
              auVar37._20_4_ = uVar9;
              auVar37._24_4_ = uVar9;
              auVar37._28_4_ = uVar9;
              local_10c0._0_4_ = local_10c0._4_4_;
              local_10c0._8_4_ = local_10c0._4_4_;
              local_10c0._12_4_ = local_10c0._4_4_;
              local_10c0[0x10] = (RTCHitN)(char)local_10c0._4_4_;
              local_10c0[0x11] = (RTCHitN)(char)((uint)local_10c0._4_4_ >> 8);
              local_10c0[0x12] = (RTCHitN)(char)((uint)local_10c0._4_4_ >> 0x10);
              local_10c0[0x13] = (RTCHitN)(char)((uint)local_10c0._4_4_ >> 0x18);
              local_10c0[0x14] = (RTCHitN)(char)local_10c0._4_4_;
              local_10c0[0x15] = (RTCHitN)(char)((uint)local_10c0._4_4_ >> 8);
              local_10c0[0x16] = (RTCHitN)(char)((uint)local_10c0._4_4_ >> 0x10);
              local_10c0[0x17] = (RTCHitN)(char)((uint)local_10c0._4_4_ >> 0x18);
              local_10c0[0x18] = (RTCHitN)(char)local_10c0._4_4_;
              local_10c0[0x19] = (RTCHitN)(char)((uint)local_10c0._4_4_ >> 8);
              local_10c0[0x1a] = (RTCHitN)(char)((uint)local_10c0._4_4_ >> 0x10);
              local_10c0[0x1b] = (RTCHitN)(char)((uint)local_10c0._4_4_ >> 0x18);
              local_10c0[0x1c] = (RTCHitN)(char)local_10c0._4_4_;
              local_10c0[0x1d] = (RTCHitN)(char)((uint)local_10c0._4_4_ >> 8);
              local_10c0[0x1e] = (RTCHitN)(char)((uint)local_10c0._4_4_ >> 0x10);
              local_10c0[0x1f] = (RTCHitN)(char)((uint)local_10c0._4_4_ >> 0x18);
              fStack_103c = local_1040;
              fStack_1038 = local_1040;
              fStack_1034 = local_1040;
              fStack_1030 = local_1040;
              fStack_102c = local_1040;
              fStack_1028 = local_1040;
              fStack_1024 = local_1040;
              local_1020 = auVar40;
              local_1000 = auVar37;
              vpcmpeqd_avx2(local_1060,local_1060);
              uStack_fdc = context->user->instID[0];
              local_fe0 = uStack_fdc;
              uStack_fd8 = uStack_fdc;
              uStack_fd4 = uStack_fdc;
              uStack_fd0 = uStack_fdc;
              uStack_fcc = uStack_fdc;
              uStack_fc8 = uStack_fdc;
              uStack_fc4 = uStack_fdc;
              uStack_fbc = context->user->instPrimID[0];
              local_fc0 = uStack_fbc;
              uStack_fb8 = uStack_fbc;
              uStack_fb4 = uStack_fbc;
              uStack_fb0 = uStack_fbc;
              uStack_fac = uStack_fbc;
              uStack_fa8 = uStack_fbc;
              uStack_fa4 = uStack_fbc;
              *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_1120 + lVar8 * 4);
              local_1260 = local_10e0;
              local_1290.valid = (int *)local_1260;
              local_1290.geometryUserPtr = pGVar1->userPtr;
              local_1290.context = context->user;
              local_1290.hit = local_10c0;
              local_1290.N = 8;
              local_12b8 = lVar14;
              local_12b0 = lVar12;
              local_12a8 = uVar15;
              local_12a0 = uVar17;
              local_1290.ray = (RTCRayN *)ray;
              if (pGVar1->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                auVar37 = ZEXT1632(auVar36);
                auVar40 = ZEXT1632(auVar39);
                (*pGVar1->intersectionFilterN)(&local_1290);
              }
              auVar25 = vpcmpeqd_avx2(local_1260,_DAT_01f7b000);
              auVar34 = _DAT_01f7b020 & ~auVar25;
              if ((((((((auVar34 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar34 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar34 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar34 >> 0x7f,0) == '\0') &&
                    (auVar34 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar34 >> 0xbf,0) == '\0') &&
                  (auVar34 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar34[0x1f]) {
                auVar25 = auVar25 ^ _DAT_01f7b020;
              }
              else {
                p_Var2 = context->args->filter;
                if ((p_Var2 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar1->field_8).field_0x2 & 0x40) != 0))))
                {
                  auVar37 = ZEXT1632(auVar37._0_16_);
                  auVar40 = ZEXT1632(auVar40._0_16_);
                  (*p_Var2)(&local_1290);
                }
                auVar3 = vpcmpeqd_avx2(local_1260,_DAT_01f7b000);
                auVar34 = vpcmpeqd_avx2(auVar40,auVar40);
                auVar25 = auVar3 ^ auVar34;
                auVar37 = vpcmpeqd_avx2(auVar37,auVar37);
                auVar34 = auVar34 & ~auVar3;
                if ((((((((auVar34 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar34 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar34 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar34 >> 0x7f,0) != '\0') ||
                      (auVar34 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar34 >> 0xbf,0) != '\0') ||
                    (auVar34 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar34[0x1f] < '\0') {
                  auVar3 = auVar3 ^ auVar37;
                  auVar34 = vmaskmovps_avx(auVar3,*(undefined1 (*) [32])local_1290.hit);
                  *(undefined1 (*) [32])(local_1290.ray + 0x180) = auVar34;
                  auVar34 = vmaskmovps_avx(auVar3,*(undefined1 (*) [32])(local_1290.hit + 0x20));
                  *(undefined1 (*) [32])(local_1290.ray + 0x1a0) = auVar34;
                  auVar34 = vmaskmovps_avx(auVar3,*(undefined1 (*) [32])(local_1290.hit + 0x40));
                  *(undefined1 (*) [32])(local_1290.ray + 0x1c0) = auVar34;
                  auVar34 = vmaskmovps_avx(auVar3,*(undefined1 (*) [32])(local_1290.hit + 0x60));
                  *(undefined1 (*) [32])(local_1290.ray + 0x1e0) = auVar34;
                  auVar34 = vmaskmovps_avx(auVar3,*(undefined1 (*) [32])(local_1290.hit + 0x80));
                  *(undefined1 (*) [32])(local_1290.ray + 0x200) = auVar34;
                  auVar34 = vpmaskmovd_avx2(auVar3,*(undefined1 (*) [32])(local_1290.hit + 0xa0));
                  *(undefined1 (*) [32])(local_1290.ray + 0x220) = auVar34;
                  auVar34 = vpmaskmovd_avx2(auVar3,*(undefined1 (*) [32])(local_1290.hit + 0xc0));
                  *(undefined1 (*) [32])(local_1290.ray + 0x240) = auVar34;
                  auVar34 = vpmaskmovd_avx2(auVar3,*(undefined1 (*) [32])(local_1290.hit + 0xe0));
                  *(undefined1 (*) [32])(local_1290.ray + 0x260) = auVar34;
                  auVar34 = vpmaskmovd_avx2(auVar3,*(undefined1 (*) [32])(local_1290.hit + 0x100));
                  *(undefined1 (*) [32])(local_1290.ray + 0x280) = auVar34;
                }
              }
              if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar25 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar25 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar25 >> 0x7f,0) == '\0') &&
                    (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar25 >> 0xbf,0) == '\0') &&
                  (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar25[0x1f]) {
                *(undefined4 *)(ray + k * 4 + 0x100) = local_12d0._0_4_;
              }
              else {
                local_12d0 = ZEXT416(*(uint *)(ray + k * 4 + 0x100));
              }
              *(undefined4 *)(local_12e0 + lVar8 * 4) = 0;
              auVar26 = ZEXT1664(local_12d0);
              uVar6 = local_12d0._0_4_;
              auVar24._4_4_ = uVar6;
              auVar24._0_4_ = uVar6;
              auVar24._8_4_ = uVar6;
              auVar24._12_4_ = uVar6;
              auVar47 = ZEXT1664(local_1230);
              auVar29 = vcmpps_avx(local_1230,auVar24,2);
              local_12e0 = vandps_avx(auVar29,local_12e0);
              auVar72 = ZEXT1664(local_1220);
              lVar12 = local_12b0;
              lVar14 = local_12b8;
              uVar15 = local_12a8;
              uVar17 = local_12a0;
            }
            if ((((local_12e0 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                 (local_12e0 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (local_12e0 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                -1 < local_12e0[0xf]) break;
            auVar33._8_4_ = 0x7f800000;
            auVar33._0_8_ = 0x7f8000007f800000;
            auVar33._12_4_ = 0x7f800000;
            auVar29 = vblendvps_avx(auVar33,auVar47._0_16_,local_12e0);
            auVar28 = vshufps_avx(auVar29,auVar29,0xb1);
            auVar28 = vminps_avx(auVar28,auVar29);
            auVar38 = vshufpd_avx(auVar28,auVar28,1);
            auVar28 = vminps_avx(auVar38,auVar28);
            auVar28 = vcmpps_avx(auVar29,auVar28,0);
            auVar38 = local_12e0 & auVar28;
            auVar29 = local_12e0;
            if ((((auVar38 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar38 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar38 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar38[0xf] < '\0') {
              auVar29 = vandps_avx(auVar28,local_12e0);
            }
            uVar7 = (ulong)lVar8 >> 0x20;
            uVar6 = vmovmskps_avx(auVar29);
            lVar8 = 0;
            for (uVar7 = CONCAT44((int)uVar7,uVar6); (uVar7 & 1) == 0;
                uVar7 = uVar7 >> 1 | 0x8000000000000000) {
              lVar8 = lVar8 + 1;
            }
          } while( true );
        }
      }
      auVar47 = ZEXT1664(local_11b0);
      auVar52 = ZEXT1664(local_11c0);
      auVar54 = ZEXT1664(local_11e0);
      auVar59 = ZEXT1664(local_11f0);
      auVar62 = ZEXT1664(local_1200);
      auVar65 = ZEXT1664(local_1210);
    }
    uVar6 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar26 = ZEXT1664(CONCAT412(uVar6,CONCAT48(uVar6,CONCAT44(uVar6,uVar6))));
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }